

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O0

uint32_t __thiscall pm::Random::integer(Random *this,uint32_t min,uint32_t max)

{
  uint32_t uVar1;
  uint32_t max_local;
  uint32_t min_local;
  Random *this_local;
  
  if (min <= max) {
    uVar1 = anon_unknown_0::boundRandom(&this->state_,&this->increment_,max - min);
    return min + uVar1;
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_all_cmakelists_25/encelo[P]pmTracer/src/Random.cpp"
                ,0x3d,"uint32_t pm::Random::integer(uint32_t, uint32_t)");
}

Assistant:

uint32_t Random::integer(uint32_t min, uint32_t max)
{
	assert(min <= max);
	return min + boundRandom(state_, increment_, max - min);
}